

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

RunnerContext * RunFuncWithArgs(Runner *runner,ASTNode *func,ASTList *args)

{
  ASTListItem *pAVar1;
  ASTListItem *pAVar2;
  RunnerContext *pRVar3;
  ASTList *pAVar4;
  int iVar5;
  int argIdx;
  int iVar6;
  bool bVar7;
  
  iVar6 = 0;
  do {
    pAVar1 = args->first;
    if (pAVar1 == (ASTListItem *)0x0) {
      pRVar3 = Run(runner,(func->meta).funcExpr.body);
      GCScope(runner,(func->meta).funcExpr.body);
      GCAstList(runner,(func->meta).funcExpr.params);
      return pRVar3;
    }
    pRVar3 = SetNodeValue(runner,pAVar1->node);
    pAVar4 = (func->meta).funcExpr.params;
    iVar5 = iVar6;
    while (pAVar2 = pAVar4->first, pAVar2 != (ASTListItem *)0x0) {
      bVar7 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar7) {
        pRVar3->node = pAVar2->node;
        break;
      }
      pAVar4 = (ASTList *)&pAVar2->next;
    }
    iVar6 = iVar6 + 1;
    args = (ASTList *)&pAVar1->next;
  } while( true );
}

Assistant:

RunnerContext* RunFuncWithArgs(Runner* runner, ASTNode* func, ASTList* args){
  DEBUG_PRINT_RUNNER("Function Scope")

  int argIdx = 0;
  FOREACH_AST(args){
    ASTNode* arg = item->node;
    int paramIdx = 0;
    RunnerContext* context = SetNodeValue(runner, arg);

    FOREACH_AST(GET_FUNC_PARAMS(func)){
      if (argIdx == paramIdx++){
        ASTNode* param = item->node;
        context->node = param;
        break;
      }
    }

    argIdx++;
  }

  RunnerContext* context = Run(runner, GET_FUNC_BODY(func));
  GCScope(runner, GET_FUNC_BODY(func));
  GCAstList(runner, GET_FUNC_PARAMS(func));
  return context;
}